

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

bool __thiscall
helics::HandleManager::addAliasName(HandleManager *this,string_view interfaceName,string_view alias)

{
  size_t __n;
  string_view *psVar1;
  iterator __position;
  string_view alias_00;
  string_view interfaceName_00;
  string_view interfaceName_01;
  string_view alias_01;
  string_view alias_02;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *this_00;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  __position_00;
  basic_string_view<char,_std::char_traits<char>_> *otherAlias;
  string_view *psVar5;
  value_type local_40;
  key_type local_30;
  
  local_40._M_str = alias._M_str;
  local_40._M_len = alias._M_len;
  local_30._M_str = interfaceName._M_str;
  local_30._M_len = interfaceName._M_len;
  if ((local_30._M_len != local_40._M_len) ||
     ((local_30._M_len != 0 &&
      (iVar3 = bcmp(local_30._M_str,local_40._M_str,local_30._M_len), iVar3 != 0)))) {
    iVar4 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->aliases)._M_h,&local_30);
    this_00 = (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
               *)std::__detail::
                 _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->aliases,&local_30);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      __position._M_current = *(basic_string_view<char,_std::char_traits<char>_> **)(this_00 + 8);
      if (__position._M_current ==
          *(basic_string_view<char,_std::char_traits<char>_> **)(this_00 + 0x10)) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>&>
                  (this_00,__position,&local_40);
      }
      else {
        (__position._M_current)->_M_len = local_40._M_len;
        (__position._M_current)->_M_str = local_40._M_str;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
      }
      interfaceName_01._M_str = local_40._M_str;
      interfaceName_01._M_len = local_40._M_len;
      alias_02._M_str = local_30._M_str;
      alias_02._M_len = local_30._M_len;
      bVar2 = addAliasName(this,interfaceName_01,alias_02);
      return bVar2;
    }
    __position_00 =
         std::
         __lower_bound<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>,std::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__ops::_Iter_less_val>
                   (*(undefined8 *)this_00,*(undefined8 *)(this_00 + 8),&local_40);
    if (((__position_00._M_current ==
          *(basic_string_view<char,_std::char_traits<char>_> **)(this_00 + 8)) ||
        (__n = (__position_00._M_current)->_M_len, __n != local_40._M_len)) ||
       ((__n != 0 &&
        (iVar3 = bcmp((__position_00._M_current)->_M_str,local_40._M_str,__n), iVar3 != 0)))) {
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::insert((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)this_00,(const_iterator)__position_00._M_current,&local_40);
      psVar1 = *(string_view **)(this_00 + 8);
      for (psVar5 = *(string_view **)this_00; psVar5 != psVar1; psVar5 = psVar5 + 1) {
        alias_00._M_str = local_40._M_str;
        alias_00._M_len = local_40._M_len;
        addAliasName(this,*psVar5,alias_00);
      }
      interfaceName_00._M_str = local_40._M_str;
      interfaceName_00._M_len = local_40._M_len;
      alias_01._M_str = local_30._M_str;
      alias_01._M_len = local_30._M_len;
      addAliasName(this,interfaceName_00,alias_01);
      return true;
    }
  }
  return false;
}

Assistant:

bool HandleManager::addAliasName(std::string_view interfaceName, std::string_view alias)
{
    if (interfaceName == alias) {
        return false;
    }
    bool cascading{false};
    auto fnd = aliases.find(interfaceName);
    if (fnd == aliases.end()) {
        aliases[interfaceName].emplace_back(alias);
        cascading = addAliasName(alias, interfaceName);
    } else {
        auto& aliasVector = aliases[interfaceName];
        auto aliasIterator = std::lower_bound(aliasVector.begin(), aliasVector.end(), alias);
        if (aliasIterator == aliasVector.end() || *aliasIterator != alias) {
            aliasVector.insert(aliasIterator, alias);
            cascading = true;
            for (auto& otherAlias : aliasVector) {
                addAliasName(otherAlias, alias);
            }
            addAliasName(alias, interfaceName);
        }
    }

    return cascading;
}